

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnVector<float>::ColumnVector(ColumnVector<float> *this)

{
  undefined8 *in_RDI;
  TypeRef *in_stack_ffffffffffffffd8;
  Column *in_stack_ffffffffffffffe0;
  
  Type::CreateSimple<float>();
  Column::Column(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x218ffb);
  *in_RDI = &PTR__ColumnVector_002a05c8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x219016);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector()
    : Column(Type::CreateSimple<T>())
{
}